

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateFinishSizePrefixed
          (KotlinGenerator *this,StructDef *struct_def,string *identifier,CodeWriter *writer,
          IDLOptions *options)

{
  string method_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if (identifier->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"",(allocator<char> *)&local_88);
  }
  else {
    std::operator+(&local_88,", \"",identifier);
    std::operator+(&local_68,&local_88,"\"");
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"finishSizePrefixed",(allocator<char> *)local_48._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Buffer",&local_ca);
  IdlNamer::LegacyJavaMethod2(&local_88,&this->namer_,&local_a8,struct_def,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"builder: FlatBufferBuilder, offset: Int",&local_ca);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
  local_48._8_8_ = &local_68;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:650:9)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:650:9)>
             ::_M_manager;
  local_48._M_unused._M_object = writer;
  GenerateFunOneLine(writer,&local_88,&local_a8,&local_c8,(function<void_()> *)&local_48,
                     options->gen_jvmstatic);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void GenerateFinishSizePrefixed(StructDef &struct_def,
                                  const std::string &identifier,
                                  CodeWriter &writer,
                                  const IDLOptions options) const {
    auto id = identifier.length() > 0 ? ", \"" + identifier + "\"" : "";
    auto params = "builder: FlatBufferBuilder, offset: Int";
    auto method_name =
        namer_.LegacyJavaMethod2("finishSizePrefixed", struct_def, "Buffer");
    GenerateFunOneLine(
        writer, method_name, params, "",
        [&]() { writer += "builder.finishSizePrefixed(offset" + id + ")"; },
        options.gen_jvmstatic);
  }